

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::Setup::InitializeRestParam
          (Setup *this,InterpreterStackFrame *newInstance,Var *dest)

{
  ushort uVar1;
  FunctionBody *this_00;
  Var *ppvVar2;
  ScriptContext *pSVar3;
  Var pvVar4;
  size_t dstCount;
  
  this_00 = this->executeFunction;
  uVar1 = (this_00->super_ParseableFunctionInfo).m_inParamCount;
  if ((int)(uint)uVar1 < this->inSlotsCount) {
    ppvVar2 = this->inParams;
    dstCount = (long)this->inSlotsCount - (ulong)uVar1;
    pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    pvVar4 = JavascriptArray::OP_NewScArray((uint32)dstCount,pSVar3);
    *dest = pvVar4;
    Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              ((void **)(*(long *)((long)pvVar4 + 0x28) + 0x18),dstCount,ppvVar2 + uVar1,dstCount);
    return;
  }
  pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
  pvVar4 = JavascriptArray::OP_NewScArray(0,pSVar3);
  *dest = pvVar4;
  return;
}

Assistant:

void InterpreterStackFrame::Setup::InitializeRestParam(InterpreterStackFrame * newInstance, Var *dest)
    {
        Var *src = this->inParams + executeFunction->GetInParamsCount();

        if (this->inSlotsCount > executeFunction->GetInParamsCount())
        {
            // Create the rest array and copy the args directly into the contiguous head segment.
            int excess = this->inSlotsCount - executeFunction->GetInParamsCount();
            *dest = JavascriptArray::OP_NewScArray(excess, executeFunction->GetScriptContext());
            JavascriptArray *array = static_cast<JavascriptArray *>(*dest);
            Field(Var)* elements = SparseArraySegment<Var>::From(array->GetHead())->elements;
            CopyArray(elements, excess, src, excess);
        }
        else
        {
            // Rest is an empty array when there are no excess parameters.
            *dest = JavascriptArray::OP_NewScArray(0, executeFunction->GetScriptContext());
        }
    }